

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,VWReaderHandler<false> *handler,
          bool isKey)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  size_t escapeOffset;
  byte *pbVar8;
  bool bVar9;
  StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1> copy;
  GenericInsituStringStream<rapidjson::UTF8<char>_> local_58;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *local_40;
  ulong local_38;
  BaseState<false> *pBVar6;
  
  local_58.head_ = is->head_;
  pbVar8 = (byte *)(is->src_ + 1);
  local_58.src_ = (Ch *)pbVar8;
  local_58.dst_ = (Ch *)pbVar8;
  local_40 = is;
  do {
    while (bVar1 = *local_58.src_, bVar1 == 0x5c) {
      escapeOffset = (long)local_58.src_ - (long)local_58.head_;
      if (ParseStringToStream<1u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>&,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>&)
          ::escape[(byte)local_58.src_[1]] == 0) {
        if (local_58.src_[1] != 0x75) {
          *(undefined4 *)(this + 0x30) = 10;
          local_58.src_ = local_58.src_ + 1;
LAB_001b7911:
          *(size_t *)(this + 0x38) = escapeOffset;
          goto LAB_001b7877;
        }
        local_58.src_ = local_58.src_ + 2;
        uVar4 = ParseHex4<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                          ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                            *)this,&local_58,escapeOffset);
        if (*(int *)(this + 0x30) != 0) goto LAB_001b7877;
        if ((uVar4 & 0xfffffc00) == 0xd800) {
          pbVar3 = (byte *)local_58.src_;
          local_38 = (ulong)uVar4;
          if ((*local_58.src_ != 0x5c) ||
             (pbVar3 = (byte *)(local_58.src_ + 1), local_58.src_[1] != 0x75)) {
            local_58.src_ = (Ch *)pbVar3;
            *(undefined4 *)(this + 0x30) = 9;
            goto LAB_001b7911;
          }
          local_58.src_ = local_58.src_ + 2;
          uVar4 = ParseHex4<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                            ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                              *)this,&local_58,escapeOffset);
          if (*(int *)(this + 0x30) == 0) {
            if (uVar4 - 0xe000 < 0xfffffc00) {
              *(undefined4 *)(this + 0x30) = 9;
              *(size_t *)(this + 0x38) = escapeOffset;
              goto LAB_001b783c;
            }
            local_38 = (ulong)((int)local_38 * 0x400 + uVar4 + 0xfca02400);
            bVar9 = true;
          }
          else {
LAB_001b783c:
            bVar9 = false;
          }
          uVar4 = (uint)local_38;
          if (!bVar9) goto LAB_001b7877;
        }
        UTF8<char>::Encode<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                  (&local_58,uVar4);
      }
      else {
        *local_58.dst_ =
             ParseStringToStream<1u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>&,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>&)
             ::escape[(byte)local_58.src_[1]];
        local_58.src_ = local_58.src_ + 2;
        local_58.dst_ = local_58.dst_ + 1;
      }
    }
    if (bVar1 == 0x22) {
      local_58.src_ = local_58.src_ + 1;
      *local_58.dst_ = 0;
      local_58.dst_ = local_58.dst_ + 1;
      goto LAB_001b7877;
    }
    if (bVar1 < 0x20) {
      if (bVar1 == 0) {
        *(undefined4 *)(this + 0x30) = 0xb;
      }
      else {
        *(undefined4 *)(this + 0x30) = 10;
      }
      *(long *)(this + 0x38) = (long)local_58.src_ - (long)local_58.head_;
LAB_001b7877:
      iVar2 = *(int *)(this + 0x30);
      if (iVar2 == 0) {
        uVar7 = (ulong)(~(uint)pbVar8 + (int)local_58.dst_);
        pBVar6 = (handler->ctx).current_state;
        if (isKey) {
          iVar5 = (*pBVar6->_vptr_BaseState[6])(pBVar6,handler,pbVar8,uVar7,0);
          pBVar6 = (BaseState<false> *)CONCAT44(extraout_var,iVar5);
        }
        else {
          iVar5 = (*pBVar6->_vptr_BaseState[4])(pBVar6,handler,pbVar8,uVar7,0);
          pBVar6 = (BaseState<false> *)CONCAT44(extraout_var_00,iVar5);
        }
        bVar9 = pBVar6 != (BaseState<false> *)0x0;
        if (bVar9) {
          (handler->ctx).previous_state = (handler->ctx).current_state;
          (handler->ctx).current_state = pBVar6;
        }
      }
      else {
        bVar9 = false;
      }
      if ((iVar2 == 0) && (!bVar9)) {
        *(undefined4 *)(this + 0x30) = 0x10;
        *(long *)(this + 0x38) = (long)local_58.src_ - (long)local_58.head_;
      }
      local_40->head_ = local_58.head_;
      local_40->src_ = local_58.src_;
      local_40->dst_ = local_58.dst_;
      return;
    }
    *local_58.dst_ = *local_58.src_;
    local_58.src_ = local_58.src_ + 1;
    local_58.dst_ = local_58.dst_ + 1;
  } while( true );
}

Assistant:

void ParseString(InputStream& is, Handler& handler, bool isKey = false)
  { internal::StreamLocalCopy<InputStream> copy(is);
    InputStream& s(copy.s);

    RAPIDJSON_ASSERT(s.Peek() == '\"');
    s.Take();  // Skip '\"'

    bool success = false;
    if (parseFlags & kParseInsituFlag)
    { typename InputStream::Ch *head = s.PutBegin();
      ParseStringToStream<parseFlags, SourceEncoding, SourceEncoding>(s, s);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
      size_t length = s.PutEnd(head) - 1;
      RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
      const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
      success = (isKey ? handler.Key(str, SizeType(length), false) : handler.String(str, SizeType(length), false));
    }
    else
    { StackStream<typename TargetEncoding::Ch> stackStream(stack_);
      ParseStringToStream<parseFlags, SourceEncoding, TargetEncoding>(s, stackStream);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
      SizeType length = static_cast<SizeType>(stackStream.Length()) - 1;
      const typename TargetEncoding::Ch* const str = stackStream.Pop();
      success = (isKey ? handler.Key(str, length, true) : handler.String(str, length, true));
    }
    if (RAPIDJSON_UNLIKELY(!success))
      RAPIDJSON_PARSE_ERROR(kParseErrorTermination, s.Tell());
  }